

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O0

void __thiscall Vector<int>::operator=(Vector<int> *this,Vector<int> *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  int local_1c;
  int i;
  Vector<int> *other_local;
  Vector<int> *this_local;
  
  if (this->N != other->N) {
    if (this->values != (int *)0x0) {
      operator_delete__(this->values);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)other->N;
    uVar2 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    piVar3 = (int *)operator_new__(uVar2);
    this->values = piVar3;
    this->N = other->N;
  }
  for (local_1c = 0; local_1c < this->N; local_1c = local_1c + 1) {
    this->values[local_1c] = other->values[local_1c];
  }
  return;
}

Assistant:

void operator=(const Vector& other)
    {
        if(N != other.N)
        {
            delete[](values);
            values = new T[other.N];
            N = other.N;
        }
        for(int i=0; i<N; ++i)
            values[i] = other.values[i];
    }